

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O3

cTValue * lj_meta_tget(lua_State *L,cTValue *o,cTValue *k)

{
  uint uVar1;
  cTValue *pcVar2;
  cTValue *pcVar3;
  uint32_t uVar4;
  TValue *pTVar5;
  ulong uVar6;
  int iVar7;
  GCtab *t;
  
  uVar4 = (o->field_2).it;
  iVar7 = 100;
  do {
    if (uVar4 == 0xfffffff4) {
      uVar1 = (o->u32).lo;
      pcVar2 = lj_tab_get(L,(GCtab *)(ulong)uVar1,k);
      if ((pcVar2->field_2).it != 0xffffffff) {
        return pcVar2;
      }
      t = (GCtab *)(ulong)(((GCtab *)(ulong)uVar1)->metatable).gcptr32;
      if (t == (GCtab *)0x0) {
        return pcVar2;
      }
      if ((t->nomm & 1) != 0) {
        return pcVar2;
      }
      pcVar3 = lj_tab_getstr(t,(GCstr *)(ulong)*(uint *)((ulong)(L->glref).ptr32 + 0x198));
      if ((pcVar3 == (cTValue *)0x0) || (uVar4 = (pcVar3->field_2).it, uVar4 == 0xffffffff)) {
        t->nomm = t->nomm | 1;
        return pcVar2;
      }
    }
    else {
      pcVar3 = lj_meta_lookup(L,o,MM_index);
      uVar4 = (pcVar3->field_2).it;
      if (uVar4 == 0xffffffff) {
        lj_err_optype(L,o,LJ_ERR_OPINDEX);
      }
    }
    if (uVar4 == 0xfffffff7) {
      uVar6 = (ulong)L->base[-1].u32.lo;
      if (*(char *)(uVar6 + 6) == '\0') {
        pTVar5 = L->base + *(byte *)((ulong)*(uint *)(uVar6 + 0x10) - 0x39);
      }
      else {
        pTVar5 = L->top;
      }
      pTVar5->n = 3.90756519295842e-320;
      pTVar5[1] = *pcVar3;
      pTVar5[2] = *o;
      pTVar5[3] = *k;
      L->top = pTVar5 + 2;
      return (cTValue *)0x0;
    }
    iVar7 = iVar7 + -1;
    o = pcVar3;
    if (iVar7 == 0) {
      lj_err_msg(L,LJ_ERR_GETLOOP);
    }
  } while( true );
}

Assistant:

cTValue *lj_meta_tget(lua_State *L, cTValue *o, cTValue *k)
{
  int loop;
  for (loop = 0; loop < LJ_MAX_IDXCHAIN; loop++) {
    cTValue *mo;
    if (LJ_LIKELY(tvistab(o))) {
      GCtab *t = tabV(o);
      cTValue *tv = lj_tab_get(L, t, k);
      if (!tvisnil(tv) ||
	  !(mo = lj_meta_fast(L, tabref(t->metatable), MM_index)))
	return tv;
    } else if (tvisnil(mo = lj_meta_lookup(L, o, MM_index))) {
      lj_err_optype(L, o, LJ_ERR_OPINDEX);
      return NULL;  /* unreachable */
    }
    if (tvisfunc(mo)) {
      L->top = mmcall(L, lj_cont_ra, mo, o, k);
      return NULL;  /* Trigger metamethod call. */
    }
    o = mo;
  }
  lj_err_msg(L, LJ_ERR_GETLOOP);
  return NULL;  /* unreachable */
}